

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O3

void __thiscall
cfd::js::api::json::SetRawReissueAssetResponse::SetRawReissueAssetResponse
          (SetRawReissueAssetResponse *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::SetRawReissueAssetResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__SetRawReissueAssetResponse_00a856b0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->hex_)._M_dataplus._M_p = (pointer)&(this->hex_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->hex_,"");
  (this->issuances_).super_JsonVector<cfd::js::api::json::IssuanceDataResponse>.
  super_vector<cfd::js::api::json::IssuanceDataResponse,_std::allocator<cfd::js::api::json::IssuanceDataResponse>_>
  .
  super__Vector_base<cfd::js::api::json::IssuanceDataResponse,_std::allocator<cfd::js::api::json::IssuanceDataResponse>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->issuances_).super_JsonVector<cfd::js::api::json::IssuanceDataResponse>.
  super_vector<cfd::js::api::json::IssuanceDataResponse,_std::allocator<cfd::js::api::json::IssuanceDataResponse>_>
  .
  super__Vector_base<cfd::js::api::json::IssuanceDataResponse,_std::allocator<cfd::js::api::json::IssuanceDataResponse>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->issuances_).super_JsonVector<cfd::js::api::json::IssuanceDataResponse>.
  super_vector<cfd::js::api::json::IssuanceDataResponse,_std::allocator<cfd::js::api::json::IssuanceDataResponse>_>
  .
  super__Vector_base<cfd::js::api::json::IssuanceDataResponse,_std::allocator<cfd::js::api::json::IssuanceDataResponse>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->issuances_).super_JsonVector<cfd::js::api::json::IssuanceDataResponse>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00a85358;
  CollectFieldName();
  return;
}

Assistant:

SetRawReissueAssetResponse() {
    CollectFieldName();
  }